

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONWriter.cpp
# Opt level: O2

void __thiscall
internalJSONNode::WriteChildren(internalJSONNode *this,uint indent,json_string *output)

{
  JSONNode **ppJVar1;
  json_string *__lhs;
  jsonChildren *pjVar2;
  uint uVar3;
  uint amount;
  long lVar4;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  json_string indent_plus_one;
  json_string local_50;
  
  pjVar2 = this->Children;
  uVar3 = pjVar2->mysize;
  if (uVar3 != 0) {
    indent_plus_one._M_dataplus._M_p = (pointer)&indent_plus_one.field_2;
    indent_plus_one._M_string_length = 0;
    indent_plus_one.field_2._M_local_buf[0] = '\0';
    if (indent == 0xffffffff) {
      amount = 0xffffffff;
    }
    else {
      __lhs = jsonSingletonNEW_LINE::getValue_abi_cxx11_();
      amount = indent + 1;
      makeIndent_abi_cxx11_(&local_50,amount);
      std::operator+(&local_90,__lhs,&local_50);
      std::__cxx11::string::operator=((string *)&indent_plus_one,(string *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
      pjVar2 = this->Children;
      uVar3 = pjVar2->mysize;
    }
    ppJVar1 = pjVar2->array;
    uVar5 = 0;
    for (lVar4 = (ulong)uVar3 << 3; lVar4 != 0; lVar4 = lVar4 + -8) {
      std::__cxx11::string::append((string *)output);
      Write(ppJVar1[uVar5]->internal,amount,this->_type == '\x04',output);
      if (uVar5 < uVar3 - 1) {
        std::__cxx11::string::push_back((char)output);
      }
      uVar5 = uVar5 + 1;
    }
    if (amount != 0xffffffff) {
      jsonSingletonNEW_LINE::getValue_abi_cxx11_();
      std::__cxx11::string::append((string *)output);
      makeIndent_abi_cxx11_(&local_90,amount - 1);
      std::__cxx11::string::append((string *)output);
      std::__cxx11::string::~string((string *)&local_90);
    }
    std::__cxx11::string::~string((string *)&indent_plus_one);
  }
  return;
}

Assistant:

void internalJSONNode::WriteChildren(unsigned int indent, json_string & output) const json_nothrow {
    //Iterate through the children and write them
    if (json_likely(CHILDREN -> empty())) return;

    json_string indent_plus_one;
    //handle whether or not it's formatted JSON
    if (indent != 0xFFFFFFFF){  //it's formatted, make the indentation strings
	   indent_plus_one = json_global(NEW_LINE) + makeIndent(++indent);
    }

    //else it's not formatted, leave the indentation strings empty
    const size_t size_minus_one = CHILDREN -> size() - 1;
    size_t i = 0;
    JSONNode ** it = CHILDREN -> begin();
    for(JSONNode ** it_end = CHILDREN -> end(); it != it_end; ++it, ++i){

		output += indent_plus_one;
		(*it) -> internal -> Write(indent, type() == JSON_ARRAY, output);
	    if (json_likely(i < size_minus_one)) output += JSON_TEXT(',');  //the last one does not get a comma, but all of the others do
    }
    if (indent != 0xFFFFFFFF){
		output += json_global(NEW_LINE);
		output += makeIndent(indent - 1);
    }
}